

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_history.c
# Opt level: O1

void fsg_history_utt_start(fsg_history_t *h)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  if (h->entries->n_valid != 0) {
    __assert_fail("blkarray_list_n_valid(h->entries) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                  ,0x10a,"void fsg_history_utt_start(fsg_history_t *)");
  }
  if (h->frame_entries != (glist_t **)0x0) {
    lVar1 = (long)h->fsg->n_state;
    if (0 < lVar1) {
      lVar2 = 0;
      do {
        if (0 < h->n_ciphone) {
          uVar3 = 0;
          do {
            if (h->frame_entries[lVar2][uVar3] != (glist_t)0x0) {
              __assert_fail("h->frame_entries[s][lc] == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                            ,0x112,"void fsg_history_utt_start(fsg_history_t *)");
            }
            uVar3 = uVar3 + 1;
          } while ((uint)h->n_ciphone != uVar3);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != lVar1);
    }
    return;
  }
  __assert_fail("h->frame_entries",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/fsg_history.c"
                ,0x10b,"void fsg_history_utt_start(fsg_history_t *)");
}

Assistant:

void
fsg_history_utt_start(fsg_history_t * h)
{
    int32 s, lc, ns, np;

    assert(blkarray_list_n_valid(h->entries) == 0);
    assert(h->frame_entries);

    ns = fsg_model_n_state(h->fsg);
    np = h->n_ciphone;

    for (s = 0; s < ns; s++) {
        for (lc = 0; lc < np; lc++) {
            assert(h->frame_entries[s][lc] == NULL);
        }
    }
}